

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::StreamingReporterBase<Catch::TestEventListenerBase>::testRunStarting
          (StreamingReporterBase<Catch::TestEventListenerBase> *this,TestRunInfo *_testRunInfo)

{
  TestRunInfo *_testRunInfo_local;
  StreamingReporterBase<Catch::TestEventListenerBase> *this_local;
  
  LazyStat<Catch::TestRunInfo>::operator=(&this->currentTestRunInfo,_testRunInfo);
  return;
}

Assistant:

void testRunStarting(TestRunInfo const& _testRunInfo) override {
            currentTestRunInfo = _testRunInfo;
        }